

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  cmSourceFile *pcVar1;
  cmake *this_00;
  pointer ppcVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  cmCustomCommand *pcVar6;
  ostream *poVar7;
  cmSourceFileLocation *pcVar8;
  pointer ppcVar9;
  pointer sourceName;
  uint uVar10;
  pointer pBVar11;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar12;
  allocator<char> local_331;
  cmSourceFile *sf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_328;
  cmGeneratorTarget *local_320;
  undefined1 local_318 [16];
  undefined1 auStack_308 [16];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_2d8;
  pointer local_2c8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  string ext;
  RegularExpression header_regex;
  
  local_320 = (cmGeneratorTarget *)files;
  GetSourceFilePaths(&srcs,this,config);
  cmsys::RegularExpression::RegularExpression
            (&header_regex,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c8 = srcs.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pBVar11 = srcs.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (sourceName = srcs.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; sourceName != pBVar11;
      sourceName = sourceName + 1) {
    sf = cmMakefile::GetOrCreateSource(this->Makefile,&sourceName->Value,false,Ambiguous);
    pVar12 = std::
             _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
             ::_M_insert_unique<cmSourceFile*const&>
                       ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                         *)&emitted,&sf);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar5 = cmSourceFile::GetExtension_abi_cxx11_(sf);
      cmsys::SystemTools::LowerCase(&ext,psVar5);
      pcVar6 = cmSourceFile::GetCustomCommand(sf);
      uVar10 = 2;
      if (pcVar6 == (cmCustomCommand *)0x0) {
        TVar4 = cmTarget::GetType(this->Target);
        uVar10 = 4;
        if (TVar4 != UTILITY) {
          TVar4 = cmTarget::GetType(this->Target);
          uVar10 = 4;
          if (TVar4 != INTERFACE_LIBRARY) {
            psVar5 = cmSourceFile::ResolveFullPath(sf,(string *)0x0,(string *)0x0);
            bVar3 = IsSourceFilePartOfUnityBatch(this,psVar5);
            pcVar1 = sf;
            uVar10 = 0xc;
            if (!bVar3) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_318,"HEADER_FILE_ONLY",&local_331);
              bVar3 = cmSourceFile::GetPropertyAsBool(pcVar1,(string *)local_318);
              std::__cxx11::string::~string((string *)local_318);
              pcVar1 = sf;
              uVar10 = 5;
              if (!bVar3) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_318,"EXTERNAL_OBJECT",&local_331);
                bVar3 = cmSourceFile::GetPropertyAsBool(pcVar1,(string *)local_318);
                std::__cxx11::string::~string((string *)local_318);
                uVar10 = 3;
                if (!bVar3) {
                  psVar5 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(sf);
                  uVar10 = 9;
                  if (psVar5->_M_string_length == 0) {
                    bVar3 = std::operator==(&ext,"def");
                    if (bVar3) {
                      TVar4 = GetType(this);
                      uVar10 = 8;
                      if (TVar4 == OBJECT_LIBRARY) {
                        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                                  (&badObjLib,&sf);
                        uVar10 = 8;
                      }
                    }
                    else {
                      bVar3 = std::operator==(&ext,"idl");
                      if (bVar3) {
                        TVar4 = GetType(this);
                        uVar10 = 6;
                        if (TVar4 == OBJECT_LIBRARY) {
                          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                                    (&badObjLib,&sf);
                          uVar10 = 6;
                        }
                      }
                      else {
                        bVar3 = std::operator==(&ext,"resx");
                        uVar10 = 10;
                        if (!bVar3) {
                          bVar3 = std::operator==(&ext,"appxmanifest");
                          uVar10 = 0;
                          if (!bVar3) {
                            bVar3 = std::operator==(&ext,"manifest");
                            pcVar1 = sf;
                            if (bVar3) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_318,"VS_DEPLOYMENT_CONTENT",&local_331);
                              bVar3 = cmSourceFile::GetPropertyAsBool(pcVar1,(string *)local_318);
                              std::__cxx11::string::~string((string *)local_318);
                              uVar10 = (uint)!bVar3 + (uint)!bVar3 * 2 + 4;
                            }
                            else {
                              bVar3 = std::operator==(&ext,"pfx");
                              uVar10 = 1;
                              if (!bVar3) {
                                bVar3 = std::operator==(&ext,"xaml");
                                uVar10 = 0xb;
                                if (!bVar3) {
                                  psVar5 = cmSourceFile::ResolveFullPath
                                                     (sf,(string *)0x0,(string *)0x0);
                                  bVar3 = cmsys::RegularExpression::find(&header_regex,psVar5);
                                  uVar10 = bVar3 | 4;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pcVar1 = sf;
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_2d8,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)&sourceName->Backtrace);
      local_318._0_8_ = pcVar1;
      local_318._8_8_ = local_2d8._M_ptr;
      auStack_308._0_8_ = local_2d8._M_refcount._M_pi;
      local_2d8._M_ptr = (element_type *)0x0;
      local_2d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      auStack_308._8_4_ = uVar10;
      std::
      vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
      emplace_back<cmGeneratorTarget::SourceAndKind>
                ((vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                  *)local_320,(SourceAndKind *)local_318);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_308);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
      std::__cxx11::string::~string((string *)&ext);
      pBVar11 = local_2c8;
    }
  }
  if (badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ext);
    poVar7 = std::operator<<((ostream *)&ext,"OBJECT library \"");
    psVar5 = GetName_abi_cxx11_(this);
    poVar7 = std::operator<<(poVar7,(string *)psVar5);
    std::operator<<(poVar7,"\" contains:\n");
    ppcVar2 = badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_320 = this;
    for (ppcVar9 = badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar2;
        ppcVar9 = ppcVar9 + 1) {
      pcVar1 = *ppcVar9;
      poVar7 = std::operator<<((ostream *)&ext,"  ");
      pcVar8 = cmSourceFile::GetLocation(pcVar1);
      poVar7 = std::operator<<(poVar7,(string *)&pcVar8->Name);
      std::operator<<(poVar7,"\n");
    }
    std::operator<<((ostream *)&ext,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    this_00 = local_320->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)&sf);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_318,(cmListFileBacktrace *)&sf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328);
    std::__cxx11::string::~string((string *)local_318);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ext);
  }
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree(&emitted._M_t);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  cmsys::RegularExpression::~RegularExpression(&header_regex);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&srcs);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (BT<std::string> const& s : srcs) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY ||
               this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY
               // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
               // NOLINTNEXTLINE(bugprone-branch-clone)
    ) {
      kind = SourceKindExtra;
    } else if (this->IsSourceFilePartOfUnityBatch(sf->ResolveFullPath())) {
      kind = SourceKindUnityBatched;
      // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
      // NOLINTNEXTLINE(bugprone-branch-clone)
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
    } else if (!sf->GetOrDetermineLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      if (sf->GetPropertyAsBool("VS_DEPLOYMENT_CONTENT")) {
        kind = SourceKindExtra;
      } else {
        kind = SourceKindManifest;
      }
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
    } else if (header_regex.find(sf->ResolveFullPath())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    files.Sources.push_back({ BT<cmSourceFile*>(sf, s.Backtrace), kind });
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (cmSourceFile* i : badObjLib) {
      e << "  " << i->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}